

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Main.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *Input;
  _Alloc_hider _Var1;
  size_type sVar2;
  undefined8 uVar3;
  pointer puVar4;
  pointer puVar5;
  pointer puVar6;
  pointer puVar7;
  pointer puVar8;
  pointer puVar9;
  bool bVar10;
  bool bVar11;
  size_t tiledata_size;
  size_t tiles_x;
  size_t tiles_y;
  ostream *poVar12;
  ulong uVar13;
  int iVar14;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a68;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_a48;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_a28;
  string name;
  Image img;
  Tilemap map;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_948;
  UnlabeledValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  outputArg;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_820;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_800;
  UnlabeledValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  imageArg;
  ofstream osfile;
  SwitchArg rleSwitch;
  CmdLine cmd;
  SwitchArg mapSwitch;
  SwitchArg size8x16Switch;
  StdOutput std_output;
  ValueArg<int> offsetArg;
  SwitchArg spriteSwitch;
  
  std::__cxx11::string::string
            ((string *)&osfile,"Convert image to Game Boy sprite or background data",
             (allocator *)&outputArg);
  std::__cxx11::string::string((string *)&imageArg,"0.1",(allocator *)&offsetArg);
  TCLAP::CmdLine::CmdLine(&cmd,(string *)&osfile,' ',(string *)&imageArg,true);
  std::__cxx11::string::~string((string *)&imageArg);
  std::__cxx11::string::~string((string *)&osfile);
  std::__cxx11::string::string((string *)&osfile,"imgtogb",(allocator *)&outputArg);
  std::__cxx11::string::string
            ((string *)&imageArg,"Simon Larsen <simonhffh@gmail.com>",(allocator *)&offsetArg);
  imgtogb::StdOutput::StdOutput(&std_output,(string *)&osfile,(string *)&imageArg);
  std::__cxx11::string::~string((string *)&imageArg);
  std::__cxx11::string::~string((string *)&osfile);
  if ((cmd._userSetOutput == false) && (cmd._output != (CmdLineOutput *)0x0)) {
    (*(cmd._output)->_vptr_CmdLineOutput[1])();
  }
  cmd._userSetOutput = true;
  cmd._output = &std_output.super_CmdLineOutput;
  std::__cxx11::string::string((string *)&osfile,"O",(allocator *)&spriteSwitch);
  std::__cxx11::string::string((string *)&imageArg,"offset",(allocator *)&size8x16Switch);
  std::__cxx11::string::string((string *)&outputArg,"Tile map offset.",(allocator *)&rleSwitch);
  std::__cxx11::string::string((string *)&mapSwitch,"offset",(allocator *)&map);
  TCLAP::ValueArg<int>::ValueArg
            (&offsetArg,(string *)&osfile,(string *)&imageArg,(string *)&outputArg,false,0,
             (string *)&mapSwitch,&cmd.super_CmdLineInterface,(Visitor *)0x0);
  std::__cxx11::string::~string((string *)&mapSwitch);
  std::__cxx11::string::~string((string *)&outputArg);
  std::__cxx11::string::~string((string *)&imageArg);
  std::__cxx11::string::~string((string *)&osfile);
  std::__cxx11::string::string((string *)&osfile,"",(allocator *)&spriteSwitch);
  std::__cxx11::string::string((string *)&imageArg,"map",(allocator *)&size8x16Switch);
  std::__cxx11::string::string((string *)&outputArg,"Produce tile map",(allocator *)&rleSwitch);
  TCLAP::SwitchArg::SwitchArg
            (&mapSwitch,(string *)&osfile,(string *)&imageArg,(string *)&outputArg,false,
             (Visitor *)0x0);
  std::__cxx11::string::~string((string *)&outputArg);
  std::__cxx11::string::~string((string *)&imageArg);
  std::__cxx11::string::~string((string *)&osfile);
  std::__cxx11::string::string((string *)&osfile,"",(allocator *)&size8x16Switch);
  std::__cxx11::string::string((string *)&imageArg,"sprite",(allocator *)&rleSwitch);
  std::__cxx11::string::string((string *)&outputArg,"Produce sprite tiles",(allocator *)&map);
  TCLAP::SwitchArg::SwitchArg
            (&spriteSwitch,(string *)&osfile,(string *)&imageArg,(string *)&outputArg,false,
             (Visitor *)0x0);
  std::__cxx11::string::~string((string *)&outputArg);
  std::__cxx11::string::~string((string *)&imageArg);
  std::__cxx11::string::~string((string *)&osfile);
  TCLAP::CmdLine::xorAdd(&cmd,&mapSwitch.super_Arg,&spriteSwitch.super_Arg);
  std::__cxx11::string::string((string *)&osfile,"",(allocator *)&rleSwitch);
  std::__cxx11::string::string((string *)&imageArg,"8x16",(allocator *)&map);
  std::__cxx11::string::string((string *)&outputArg,"Enable 8x16 sprite mode.",(allocator *)&img);
  TCLAP::SwitchArg::SwitchArg
            (&size8x16Switch,(string *)&osfile,(string *)&imageArg,(string *)&outputArg,
             &cmd.super_CmdLineInterface,false,(Visitor *)0x0);
  std::__cxx11::string::~string((string *)&outputArg);
  std::__cxx11::string::~string((string *)&imageArg);
  std::__cxx11::string::~string((string *)&osfile);
  std::__cxx11::string::string((string *)&osfile,"r",(allocator *)&map);
  std::__cxx11::string::string((string *)&imageArg,"rle",(allocator *)&img);
  std::__cxx11::string::string((string *)&outputArg,"Compress data using RLE.",(allocator *)&name);
  TCLAP::SwitchArg::SwitchArg
            (&rleSwitch,(string *)&osfile,(string *)&imageArg,(string *)&outputArg,
             &cmd.super_CmdLineInterface,false,(Visitor *)0x0);
  std::__cxx11::string::~string((string *)&outputArg);
  std::__cxx11::string::~string((string *)&imageArg);
  std::__cxx11::string::~string((string *)&osfile);
  std::__cxx11::string::string((string *)&osfile,"image",(allocator *)&img);
  std::__cxx11::string::string((string *)&outputArg,"Image file path",(allocator *)&name);
  std::__cxx11::string::string((string *)&local_800,"",(allocator *)&local_a68);
  std::__cxx11::string::string((string *)&map,"IMAGE",(allocator *)&local_a28);
  TCLAP::
  UnlabeledValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::UnlabeledValueArg(&imageArg,(string *)&osfile,(string *)&outputArg,true,&local_800,
                      (string *)&map,&cmd.super_CmdLineInterface,false,(Visitor *)0x0);
  std::__cxx11::string::~string((string *)&map);
  std::__cxx11::string::~string((string *)&local_800);
  std::__cxx11::string::~string((string *)&outputArg);
  std::__cxx11::string::~string((string *)&osfile);
  std::__cxx11::string::string((string *)&osfile,"output",(allocator *)&name);
  std::__cxx11::string::string((string *)&map,"Output file path",(allocator *)&local_a68);
  std::__cxx11::string::string((string *)&local_820,"",(allocator *)&local_a28);
  std::__cxx11::string::string((string *)&img,"OUTPUT",(allocator *)&local_a48);
  iVar14 = 1;
  TCLAP::
  UnlabeledValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::UnlabeledValueArg(&outputArg,(string *)&osfile,(string *)&map,true,&local_820,(string *)&img,
                      &cmd.super_CmdLineInterface,false,(Visitor *)0x0);
  std::__cxx11::string::~string((string *)&img);
  std::__cxx11::string::~string((string *)&local_820);
  std::__cxx11::string::~string((string *)&map);
  std::__cxx11::string::~string((string *)&osfile);
  TCLAP::CmdLine::parse(&cmd,argc,argv);
  if ((int)offsetArg.super_Arg._164_4_ < 0) {
    poVar12 = std::operator<<((ostream *)&std::cerr,"error: Tile map offset must be non-negative.");
    std::endl<char,std::char_traits<char>>(poVar12);
    iVar14 = 1;
    goto LAB_00113b7a;
  }
  cimg_library::CImg<unsigned_char>::CImg
            (&img,imageArg.
                  super_ValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ._value._M_dataplus._M_p);
  name._M_dataplus._M_p = (pointer)&name.field_2;
  name._M_string_length = 0;
  name.field_2._M_local_buf[0] = '\0';
  if ((outputArg.
       super_ValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
       .super_Arg._alreadySet == true) &&
     (outputArg.
      super_ValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      .super_Arg._xorSet == false)) {
    basename((char *)&osfile);
  }
  else {
    basename((char *)&osfile);
  }
  std::__cxx11::string::operator=((string *)&name,(string *)&osfile);
  std::__cxx11::string::~string((string *)&osfile);
  Input = &outputArg.
           super_ValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           ._value;
  std::locale::locale((locale *)&osfile);
  bVar10 = boost::algorithm::iends_with<std::__cxx11::string,char[3]>
                     (Input,(char (*) [3])".h",(locale *)&osfile);
  bVar11 = true;
  if (!bVar10) {
    std::locale::locale((locale *)&map);
    bVar11 = boost::algorithm::iends_with<std::__cxx11::string,char[3]>
                       (Input,(char (*) [3])".c",(locale *)&map);
    std::locale::~locale((locale *)&map);
  }
  std::locale::~locale((locale *)&osfile);
  if (bVar11 == false) {
    std::locale::locale((locale *)&osfile);
    bVar10 = boost::algorithm::iends_with<std::__cxx11::string,char[5]>
                       (Input,(char (*) [5])".asm",(locale *)&osfile);
    if (bVar10) {
LAB_00113812:
      std::locale::~locale((locale *)&osfile);
      goto LAB_0011381f;
    }
    std::locale::locale((locale *)&map);
    bVar10 = boost::algorithm::iends_with<std::__cxx11::string,char[3]>
                       (Input,(char (*) [3])".s",(locale *)&map);
    if (bVar10) {
LAB_00113805:
      std::locale::~locale((locale *)&map);
      goto LAB_00113812;
    }
    std::locale::locale((locale *)&local_a68);
    bVar10 = boost::algorithm::iends_with<std::__cxx11::string,char[7]>
                       (Input,(char (*) [7])".gbz80",(locale *)&local_a68);
    if (bVar10) {
LAB_001137fb:
      std::locale::~locale((locale *)&local_a68);
      goto LAB_00113805;
    }
    std::locale::locale((locale *)&local_a28);
    bVar10 = boost::algorithm::iends_with<std::__cxx11::string,char[5]>
                       (Input,(char (*) [5])".z80",(locale *)&local_a28);
    if (bVar10) {
      std::locale::~locale((locale *)&local_a28);
      goto LAB_001137fb;
    }
    std::locale::locale((locale *)&local_a48);
    bVar10 = boost::algorithm::iends_with<std::__cxx11::string,char[5]>
                       (Input,(char (*) [5])0x13a429,(locale *)&local_a48);
    std::locale::~locale((locale *)&local_a48);
    std::locale::~locale((locale *)&local_a28);
    std::locale::~locale((locale *)&local_a68);
    std::locale::~locale((locale *)&map);
    std::locale::~locale((locale *)&osfile);
    if (bVar10) goto LAB_0011381f;
    poVar12 = std::operator<<((ostream *)&std::cerr,"error: Unknown file ending for output file");
    std::endl<char,std::char_traits<char>>(poVar12);
    poVar12 = std::operator<<((ostream *)&std::cerr,"Known types:");
    std::endl<char,std::char_traits<char>>(poVar12);
    poVar12 = std::operator<<((ostream *)&std::cerr,"\tC: .c, .asm ");
    std::endl<char,std::char_traits<char>>(poVar12);
    poVar12 = std::operator<<((ostream *)&std::cerr,"\tRGBDS: .asm, .s, .gbz80, .z80, .inc");
    std::endl<char,std::char_traits<char>>(poVar12);
  }
  else {
LAB_0011381f:
    std::ofstream::ofstream((string *)&osfile);
    poVar12 = (ostream *)&std::cout;
    if ((outputArg.
         super_ValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         .super_Arg._alreadySet == true) &&
       (outputArg.
        super_ValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        .super_Arg._xorSet == false)) {
      std::ofstream::open((string *)&osfile,(_Ios_Openmode)Input);
      poVar12 = (ostream *)&osfile;
    }
    if (mapSwitch.super_Arg._163_1_ == '\x01') {
      imgtogb::Tilemap::Tilemap(&map,&img,offsetArg.super_Arg._164_4_);
      local_a28._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_a28._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_a28._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_a48._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_a48._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_a48._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      imgtogb::Tilemap::getTileMap
                (&map,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_a28);
      imgtogb::Tilemap::getTileData
                (&map,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_a48);
      if (rleSwitch.super_Arg._163_1_ == '\x01') {
        local_a68._M_dataplus._M_p = (pointer)0x0;
        local_a68._M_string_length = 0;
        local_a68.field_2._M_allocated_capacity = 0;
        local_948._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_948._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_948._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        imgtogb::rle_encode((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_a28,
                            (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_a68);
        imgtogb::rle_encode((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_a48,
                            (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_948);
        puVar9 = local_a28._M_impl.super__Vector_impl_data._M_end_of_storage;
        puVar8 = local_a28._M_impl.super__Vector_impl_data._M_finish;
        puVar7 = local_a28._M_impl.super__Vector_impl_data._M_start;
        puVar6 = local_a48._M_impl.super__Vector_impl_data._M_end_of_storage;
        puVar5 = local_a48._M_impl.super__Vector_impl_data._M_finish;
        puVar4 = local_a48._M_impl.super__Vector_impl_data._M_start;
        local_a28._M_impl.super__Vector_impl_data._M_end_of_storage =
             (pointer)local_a68.field_2._M_allocated_capacity;
        local_a28._M_impl.super__Vector_impl_data._M_start = (pointer)local_a68._M_dataplus._M_p;
        local_a28._M_impl.super__Vector_impl_data._M_finish = (pointer)local_a68._M_string_length;
        local_a68._M_dataplus._M_p = (pointer)puVar7;
        local_a68._M_string_length = (size_type)puVar8;
        local_a68.field_2._M_allocated_capacity = (size_type)puVar9;
        local_a48._M_impl.super__Vector_impl_data._M_end_of_storage =
             local_948._M_impl.super__Vector_impl_data._M_end_of_storage;
        local_a48._M_impl.super__Vector_impl_data._M_start =
             local_948._M_impl.super__Vector_impl_data._M_start;
        local_a48._M_impl.super__Vector_impl_data._M_finish =
             local_948._M_impl.super__Vector_impl_data._M_finish;
        local_948._M_impl.super__Vector_impl_data._M_start = puVar4;
        local_948._M_impl.super__Vector_impl_data._M_finish = puVar5;
        local_948._M_impl.super__Vector_impl_data._M_end_of_storage = puVar6;
        std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_948);
        std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                  ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&local_a68);
      }
      if (bVar11 == false) {
        std::operator+(&local_a68,&name,"_data");
        emitASMArray((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_a48,&local_a68,
                     poVar12);
        std::__cxx11::string::~string((string *)&local_a68);
        std::operator+(&local_a68,&name,"_tiles");
        emitASMArray((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_a28,&local_a68,
                     poVar12);
        std::__cxx11::string::~string((string *)&local_a68);
      }
      else {
        tiledata_size = imgtogb::Tilemap::getTileDataSize(&map);
        tiles_x = imgtogb::Tilemap::getTilesX(&map);
        tiles_y = imgtogb::Tilemap::getTilesY(&map);
        emitMapCHeader((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_a28,
                       tiledata_size,tiles_x,tiles_y,offsetArg.super_Arg._164_4_,
                       (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_a48,&name,
                       poVar12);
      }
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_a48);
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_a28);
      imgtogb::Tilemap::~Tilemap(&map);
    }
    else {
      local_a68._M_dataplus._M_p = (pointer)0x0;
      local_a68._M_string_length = 0;
      local_a68.field_2._M_allocated_capacity = 0;
      produceSpriteData(&img,(bool)size8x16Switch.super_Arg._163_1_,
                        (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_a68);
      uVar13 = local_a68._M_string_length - (long)local_a68._M_dataplus._M_p;
      if (rleSwitch.super_Arg._163_1_ == '\x01') {
        map.img = (Image *)0x0;
        map.offset = 0;
        map._12_4_ = 0;
        map.tiles_x = 0;
        imgtogb::rle_encode((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_a68,
                            (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&map);
        uVar3 = local_a68.field_2._M_allocated_capacity;
        sVar2 = local_a68._M_string_length;
        _Var1._M_p = local_a68._M_dataplus._M_p;
        local_a68.field_2._M_allocated_capacity = map.tiles_x;
        local_a68._M_dataplus._M_p = (pointer)map.img;
        local_a68._M_string_length = map._8_8_;
        map.img = (Image *)_Var1._M_p;
        map._8_8_ = sVar2;
        map.tiles_x = uVar3;
        std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                  ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&map);
      }
      if (bVar11 == false) {
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&map,
                       &name,"_data");
        emitASMArray((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_a68,
                     (string *)&map,poVar12);
        std::__cxx11::string::~string((string *)&map);
      }
      else {
        emitSpriteCHeader((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_a68,
                          uVar13 >> 4,&name,poVar12);
      }
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&local_a68);
    }
    std::ofstream::~ofstream(&osfile);
    iVar14 = 0;
  }
  std::__cxx11::string::~string((string *)&name);
  cimg_library::CImg<unsigned_char>::~CImg(&img);
LAB_00113b7a:
  TCLAP::ValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~ValueArg(&outputArg.
               super_ValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             );
  TCLAP::ValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~ValueArg(&imageArg.
               super_ValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             );
  TCLAP::Arg::~Arg(&rleSwitch.super_Arg);
  TCLAP::Arg::~Arg(&size8x16Switch.super_Arg);
  TCLAP::Arg::~Arg(&spriteSwitch.super_Arg);
  TCLAP::Arg::~Arg(&mapSwitch.super_Arg);
  TCLAP::ValueArg<int>::~ValueArg(&offsetArg);
  imgtogb::StdOutput::~StdOutput(&std_output);
  TCLAP::CmdLine::~CmdLine(&cmd);
  return iVar14;
}

Assistant:

int main(int argc, const char *argv[]) {
	TCLAP::CmdLine cmd("Convert image to Game Boy sprite or background data",' ',"0.1");
	imgtogb::StdOutput std_output("imgtogb", "Simon Larsen <simonhffh@gmail.com>");
	cmd.setOutput(&std_output);

	TCLAP::ValueArg<int> offsetArg("O", "offset", "Tile map offset.", false, 0, "offset", cmd);
	TCLAP::SwitchArg mapSwitch("", "map", "Produce tile map", false);
	TCLAP::SwitchArg spriteSwitch("", "sprite", "Produce sprite tiles", false);
	cmd.xorAdd(mapSwitch, spriteSwitch);
	TCLAP::SwitchArg size8x16Switch("", "8x16", "Enable 8x16 sprite mode.", cmd);
	TCLAP::SwitchArg rleSwitch("r", "rle", "Compress data using RLE.", cmd);
	TCLAP::UnlabeledValueArg<std::string> imageArg("image", "Image file path", true, "", "IMAGE", cmd);
	TCLAP::UnlabeledValueArg<std::string> outputArg("output", "Output file path", true, "", "OUTPUT", cmd);

	cmd.parse(argc, argv);

	if(offsetArg.getValue() < 0) {
		std::cerr << "error: Tile map offset must be non-negative." << std::endl;
		return 1;
	}

	Image img(imageArg.getValue().c_str());

	// Get basename
	std::string name;
	if(outputArg.isSet()) {
		name = basename(outputArg.getValue());
	} else {
		name = basename(imageArg.getValue());
	}

	// Determine output file ending
	Target target;
	if(boost::algorithm::iends_with(outputArg.getValue(), ".h")
	|| boost::algorithm::iends_with(outputArg.getValue(), ".c")) {
		target = Target::C;
	}
	else if(boost::algorithm::iends_with(outputArg.getValue(), ".asm")
	|| boost::algorithm::iends_with(outputArg.getValue(), ".s")
	|| boost::algorithm::iends_with(outputArg.getValue(), ".gbz80")
	|| boost::algorithm::iends_with(outputArg.getValue(), ".z80")
	|| boost::algorithm::iends_with(outputArg.getValue(), ".inc")) {
		target = Target::ASM;
	}
	else {
		std::cerr << "error: Unknown file ending for output file" << std::endl;
		std::cerr << "Known types:" << std::endl;
		std::cerr << "\tC: .c, .asm " << std::endl;
		std::cerr << "\tRGBDS: .asm, .s, .gbz80, .z80, .inc" << std::endl;
		return 1;
	}

	// Get output stream
	std::ofstream osfile;
	std::ostream &output_stream = outputArg.isSet()
		? osfile.open(outputArg.getValue()), osfile
		: std::cout;

	// Output tile map
	if(mapSwitch.getValue()) {
		Tilemap map(img, offsetArg.getValue());
		std::vector<unsigned char> tilemap, tiledata;
		map.getTileMap(tilemap);
		map.getTileData(tiledata);
		if(rleSwitch.getValue()) {
			std::vector<unsigned char> tilemap_rle, tiledata_rle;
			rle_encode(tilemap, tilemap_rle);
			rle_encode(tiledata, tiledata_rle);
			tilemap.swap(tilemap_rle);
			tiledata.swap(tiledata_rle);
		}
		if(target == Target::C) {
			emitMapCHeader(tilemap, map.getTileDataSize(), map.getTilesX(), map.getTilesY(), offsetArg.getValue(), tiledata, name, output_stream);
		} else if(target == Target::ASM) {
			emitASMArray(tiledata, name+"_data", output_stream);
			emitASMArray(tilemap, name+"_tiles", output_stream);
		}
	}
	// Output sprite data
	else {
		std::vector<unsigned char> data;
		produceSpriteData(img, size8x16Switch.getValue(), data);
		size_t data_length = data.size() / 16;
		if(rleSwitch.getValue()) {
			std::vector<unsigned char> data_rle;
			rle_encode(data, data_rle);
			data.swap(data_rle);
		}
		if(target == Target::C) {
			emitSpriteCHeader(data, data_length, name, output_stream);
		} else if(target == Target::ASM) {
			emitASMArray(data, name+"_data", output_stream);
		}
	}

	return 0;
}